

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bellman_ford.cpp
# Opt level: O3

bool bellmanFord(Graph *G,int *s,WeightMap *weight,
                vector<unsigned_long,_std::allocator<unsigned_long>_> *pred,
                vector<long,_std::allocator<long>_> *dist)

{
  pointer puVar1;
  pointer psVar2;
  pointer psVar3;
  pointer plVar4;
  pointer psVar5;
  ulong *puVar6;
  ulong *puVar7;
  Graph *pGVar8;
  undefined1 auVar9 [16];
  size_type __n;
  bool bVar10;
  _Bit_type *p_Var11;
  byte bVar12;
  int iVar13;
  type *ptVar14;
  void *pvVar15;
  long lVar16;
  long lVar17;
  unsigned_long uVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  pointer psVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  AdjList *g_1;
  Vertex v;
  Vertex NIL;
  EdgeIterator ei;
  queue<int,_std::deque<int,_std::allocator<int>_>_> Q;
  Graph g;
  EdgeIterator ei_end;
  ulong local_298;
  unsigned_long local_290;
  undefined8 local_288;
  undefined1 uStack_280;
  undefined7 uStack_27f;
  long lStack_278;
  byte bStack_270;
  ulong *local_268;
  ulong local_260;
  ulong *local_258;
  ulong local_250;
  long local_248;
  int *local_240;
  int local_234;
  size_type local_230;
  ulong local_228;
  vector<bool,_std::allocator<bool>_> local_220;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  int *local_1c8;
  _Elt_pointer piStack_1c0;
  undefined1 local_1b8 [16];
  vector<bool,_std::allocator<bool>_> local_1a8;
  pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>_>
  local_180;
  WeightMap *local_f0;
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  local_e8;
  vector<bool,_std::allocator<bool>_> local_b0;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  undefined8 uStack_78;
  char cStack_70;
  ulong *local_68;
  allocator_type *local_40;
  undefined8 *local_38;
  
  uVar19 = (long)(G->super_type).m_vertices.
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(G->super_type).m_vertices.
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  uVar22 = uVar19 >> 5;
  local_1b8 = (undefined1  [16])0x0;
  local_1c8 = (int *)0x0;
  piStack_1c0 = (_Elt_pointer)0x0;
  local_1d8 = (undefined1  [16])0x0;
  local_1e8 = (undefined1  [16])0x0;
  local_1f8 = (undefined1  [16])0x0;
  local_f0 = weight;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map
            ((_Deque_base<int,_std::allocator<int>_> *)local_1f8,0);
  local_230 = (size_type)(int)uVar22;
  local_180.first.vBegin.m_value = local_180.first.vBegin.m_value & 0xffffffffffffff00;
  local_228 = uVar22;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_220,local_230,(bool *)&local_180,(allocator_type *)&local_288);
  auVar9 = _DAT_00115040;
  local_290 = 0xffffffffffffffff;
  if ((uVar19 & 0x1fffffffff) != 0) {
    lVar16 = local_230 + (local_230 == 0);
    puVar1 = (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar17 = lVar16 + -1;
    auVar24._8_4_ = (int)lVar17;
    auVar24._0_8_ = lVar17;
    auVar24._12_4_ = (int)((ulong)lVar17 >> 0x20);
    uVar18 = 0;
    auVar24 = auVar24 ^ _DAT_00115040;
    auVar25 = _DAT_00115030;
    do {
      auVar26 = auVar25 ^ auVar9;
      if ((bool)(~(auVar26._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar26._0_4_ ||
                  auVar24._4_4_ < auVar26._4_4_) & 1)) {
        puVar1[uVar18] = uVar18;
      }
      if ((auVar26._12_4_ != auVar24._12_4_ || auVar26._8_4_ <= auVar24._8_4_) &&
          auVar26._12_4_ <= auVar24._12_4_) {
        puVar1[uVar18 + 1] = uVar18 + 1;
      }
      uVar18 = uVar18 + 2;
      lVar17 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + 2;
      auVar25._8_8_ = lVar17 + 2;
    } while ((lVar16 + 1U & 0xfffffffffffffffe) != uVar18);
  }
  iVar13 = *s;
  (dist->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data._M_start
  [iVar13] = 0;
  if (local_1c8 == (int *)(local_1b8._0_8_ + -4)) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)local_1f8,s);
  }
  else {
    *local_1c8 = iVar13;
    local_1c8 = local_1c8 + 1;
  }
  iVar13 = *s;
  iVar20 = iVar13 + 0x3f;
  if (-1 < (long)iVar13) {
    iVar20 = iVar13;
  }
  local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p
  [(long)(iVar20 >> 6) + ((ulong)(((long)iVar13 & 0x800000000000003fU) < 0x8000000000000001) - 1)] =
       local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p
       [(long)(iVar20 >> 6) +
        ((ulong)(((long)iVar13 & 0x800000000000003fU) < 0x8000000000000001) - 1)] |
       1L << ((byte)iVar13 & 0x3f);
  if (local_1c8 == (int *)(local_1b8._0_8_ + -4)) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<unsigned_long_const&>
              ((deque<int,std::allocator<int>> *)local_1f8,&local_290);
  }
  else {
    *local_1c8 = (int)local_290;
    local_1c8 = local_1c8 + 1;
  }
  local_240 = s;
  if ((int)local_228 < 1) {
LAB_00111f02:
    bVar10 = false;
  }
  else {
    bVar10 = true;
    iVar13 = 0;
    do {
      while( true ) {
        local_234 = iVar13;
        iVar13 = *(int *)local_1e8._0_8_;
        if ((int *)local_1e8._0_8_ == (int *)(local_1d8._0_8_ + -4)) {
          operator_delete((void *)local_1e8._8_8_,0x200);
          local_1e8._0_8_ = *(_Map_pointer)(local_1d8._8_8_ + 8);
          local_1d8._8_8_ = (_Map_pointer)(local_1d8._8_8_ + 8);
          local_1d8._0_8_ = (int *)(local_1e8._0_8_ + 0x200);
          local_1e8._8_8_ = local_1e8._0_8_;
        }
        else {
          local_1e8._0_8_ = local_1e8._0_8_ + 4;
        }
        uVar19 = (ulong)iVar13;
        if (local_290 == uVar19) break;
        iVar20 = iVar13;
        if (iVar13 < 0) {
          iVar20 = iVar13 + 0x3f;
        }
        bVar12 = (byte)iVar13 & 0x3f;
        local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p
        [(long)(iVar20 >> 6) + ((ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
             local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [(long)(iVar20 >> 6) +
              ((ulong)((uVar19 & 0x800000000000003f) < 0x8000000000000001) - 1)] &
             (-2L << bVar12 | 0xfffffffffffffffeU >> 0x40 - bVar12);
        psVar2 = (G->super_type).m_vertices.
                 super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar23 = *(pointer *)
                   &psVar2[uVar19].super_StoredVertex.m_out_edges.
                    super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
        ;
        psVar3 = *(pointer *)
                  ((long)&psVar2[uVar19].super_StoredVertex.m_out_edges.
                          super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                  + 8);
        if (psVar23 != psVar3) {
          lVar16 = (dist->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar19];
          p_Var11 = local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          do {
            local_298 = (psVar23->super_stored_edge<unsigned_long>).m_target;
            lVar17 = *(int *)((long)(psVar23->m_property)._M_t.
                                    super___uniq_ptr_impl<EdgeProperties,_std::default_delete<EdgeProperties>_>
                                    ._M_t + local_f0->tag) + lVar16;
            puVar1 = (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            plVar4 = (dist->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            if (((puVar1[local_298] == local_298) && (local_298 != (long)*local_240)) ||
               (lVar17 < plVar4[local_298])) {
              plVar4[local_298] = lVar17;
              puVar1[local_298] = uVar19;
              uVar22 = local_298 + 0x3f;
              if (-1 < (long)local_298) {
                uVar22 = local_298;
              }
              lVar17 = (long)uVar22 >> 6;
              uVar22 = local_298 & 0x800000000000003f;
              bVar12 = (byte)local_298;
              if ((p_Var11[lVar17 + ((ulong)(uVar22 < 0x8000000000000001) - 1)] >>
                   (local_298 & 0x3f) & 1) == 0) {
                if (local_1c8 == (int *)(local_1b8._0_8_ + -4)) {
                  std::deque<int,std::allocator<int>>::_M_push_back_aux<unsigned_long&>
                            ((deque<int,std::allocator<int>> *)local_1f8,&local_298);
                  uVar22 = local_298 + 0x3f;
                  if (-1 < (long)local_298) {
                    uVar22 = local_298;
                  }
                  lVar17 = (long)uVar22 >> 6;
                  uVar22 = local_298 & 0x800000000000003f;
                  bVar12 = (byte)local_298;
                  p_Var11 = local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                }
                else {
                  *local_1c8 = (int)local_298;
                  local_1c8 = local_1c8 + 1;
                }
                p_Var11[lVar17 + ((ulong)(uVar22 < 0x8000000000000001) - 1)] =
                     p_Var11[lVar17 + ((ulong)(uVar22 < 0x8000000000000001) - 1)] |
                     1L << (bVar12 & 0x3f);
              }
            }
            psVar23 = psVar23 + 1;
          } while (psVar23 != psVar3);
        }
        iVar13 = local_234;
        if (!bVar10) goto LAB_00111f02;
      }
      if (local_1c8 == (int *)local_1e8._0_8_) goto LAB_00112518;
      if (local_1c8 == (int *)(local_1b8._0_8_ + -4)) {
        std::deque<int,std::allocator<int>>::_M_push_back_aux<unsigned_long_const&>
                  ((deque<int,std::allocator<int>> *)local_1f8,&local_290);
      }
      else {
        *local_1c8 = iVar13;
        local_1c8 = local_1c8 + 1;
      }
      iVar13 = local_234 + 1;
      bVar10 = iVar13 < (int)local_228;
    } while (iVar13 != (int)local_228);
  }
  __n = local_230;
  if ((pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[*local_240] != (long)*local_240) {
LAB_00112518:
    if (local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_offset = 0;
      local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    }
    std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
              ((_Deque_base<int,_std::allocator<int>_> *)local_1f8);
    return bVar10;
  }
  local_180.first.vBegin.m_value = local_180.first.vBegin.m_value & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_1a8,local_230,(bool *)&local_180,(allocator_type *)&local_288);
  local_180.first.vBegin.m_value = local_180.first.vBegin.m_value & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_b0,__n,(bool *)&local_180,(allocator_type *)&local_288);
  boost::
  adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>
  ::adjacency_list(&local_e8,(no_property *)&local_180);
  lStack_278 = 0;
  bStack_270 = 0;
  local_288 = 0;
  uStack_280 = 0;
  uStack_27f = 0;
  uStack_78 = 0;
  cStack_70 = '\0';
  local_88 = 0;
  local_80 = 0;
  uStack_7f = 0;
  psVar2 = (G->super_type).m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar5 = (G->super_type).m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_180.first.vEnd.m_value = (long)psVar5 - (long)psVar2 >> 5;
  if (psVar5 == psVar2) {
    pvVar15 = (void *)0x0;
  }
  else {
    ptVar14 = (type *)&(psVar2->super_StoredVertex).m_out_edges.
                       super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
    local_180.first.vCurr.m_value = 0;
    do {
      if (*ptVar14 != (type)((_Vector_impl_data *)(ptVar14 + -1))->_M_start) {
        local_180.first.edges.super_type.m_initialized = true;
        local_180.first.edges.super_type.m_storage.dummy_.aligner_ =
             (type)((_Vector_impl_data *)(ptVar14 + -1))->_M_start;
        local_180.first.edges.super_type.m_storage.dummy_._8_8_ = local_180.first.vCurr.m_value;
        local_180.first.edges.super_type.m_storage.dummy_._16_8_ = *ptVar14;
        local_180.first.edges.super_type.m_storage.dummy_._24_8_ = local_180.first.vCurr.m_value;
        goto LAB_00112051;
      }
      local_180.first.vCurr.m_value = local_180.first.vCurr.m_value + 1;
      ptVar14 = ptVar14 + 4;
      pvVar15 = (void *)local_180.first.vEnd.m_value;
    } while (local_180.first.vEnd.m_value != local_180.first.vCurr.m_value);
  }
  local_180.first.edges.super_type.m_initialized = false;
  local_180.first.vCurr.m_value = (value_type)pvVar15;
LAB_00112051:
  local_180.first.vBegin.m_value = 0;
  local_180.second.vBegin.m_value = 0;
  local_180.second.edges.super_type.m_initialized = false;
  local_180.first.m_g = G;
  local_180.second.vCurr.m_value = local_180.first.vEnd.m_value;
  local_180.second.vEnd.m_value = local_180.first.vEnd.m_value;
  local_180.second.m_g = G;
  local_40 = (allocator_type *)&local_288;
  local_38 = &local_88;
  boost::tuples::
  tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&local_40,&local_180);
LAB_001120a1:
  uVar19 = local_260;
  if (CONCAT71(uStack_27f,uStack_280) == CONCAT71(uStack_7f,local_80)) {
    if (CONCAT71(uStack_27f,uStack_280) != lStack_278) {
      if ((bStack_270 == 0) || (cStack_70 == '\0')) goto LAB_00112577;
      if (local_268 != local_68) goto LAB_001120ed;
    }
    dfs(&local_e8,local_240,&local_1a8);
    psVar2 = (G->super_type).m_vertices.
             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar5 = (G->super_type).m_vertices.
             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_180.first.vEnd.m_value = (long)psVar5 - (long)psVar2 >> 5;
    if (psVar5 != psVar2) {
      ptVar14 = (type *)&(psVar2->super_StoredVertex).m_out_edges.
                         super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
      local_180.first.vCurr.m_value = 0;
      goto LAB_0011225d;
    }
    pvVar15 = (void *)0x0;
    goto LAB_0011227c;
  }
LAB_001120ed:
  if ((bStack_270 & 1) == 0) goto LAB_00112577;
  uVar22 = *local_268;
  if (local_260 ==
      (pred->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar22]) {
    uVar21 = uVar22;
    if (uVar22 < local_260) {
      uVar21 = local_260;
    }
    if ((ulong)((long)local_e8.super_type.m_vertices.
                      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_e8.super_type.m_vertices.
                      super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar21) {
      std::
      vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
      ::resize(&local_e8.super_type.m_vertices,uVar21 + 1);
    }
    psVar2 = local_e8.super_type.m_vertices.
             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_180.first.vBegin.m_value = uVar22;
    local_180.first.vCurr.m_value = (value_type)operator_new(4);
    std::
    vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
    ::emplace_back<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>
              ((vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>
                *)(psVar2 + uVar19),
               (stored_edge_property<unsigned_long,_EdgeProperties> *)&local_180);
    if ((void *)local_180.first.vCurr.m_value != (void *)0x0) {
      operator_delete((void *)local_180.first.vCurr.m_value,4);
    }
  }
  if ((bStack_270 & 1) != 0) {
    local_268 = local_268 + 2;
    if (local_268 == local_258) {
      uVar19 = CONCAT71(uStack_27f,uStack_280);
      lVar16 = uVar19 * 0x20 + 0x28;
      do {
        if (lStack_278 - 1U == uVar19) {
          uStack_280 = (undefined1)lStack_278;
          uStack_27f = (undefined7)((ulong)lStack_278 >> 8);
          goto LAB_001120a1;
        }
        puVar6 = *(ulong **)(*(long *)(local_248 + 0x18) + -8 + lVar16);
        puVar7 = *(ulong **)(*(long *)(local_248 + 0x18) + lVar16);
        lVar16 = lVar16 + 0x20;
        uVar19 = uVar19 + 1;
      } while (puVar7 == puVar6);
      uStack_280 = (undefined1)uVar19;
      uStack_27f = (undefined7)(uVar19 >> 8);
      local_268 = puVar6;
      local_260 = uVar19;
      local_258 = puVar7;
      local_250 = uVar19;
    }
    goto LAB_001120a1;
  }
  goto LAB_00112596;
  while( true ) {
    local_180.first.vCurr.m_value = local_180.first.vCurr.m_value + 1;
    ptVar14 = ptVar14 + 4;
    pvVar15 = (void *)local_180.first.vEnd.m_value;
    if (local_180.first.vEnd.m_value == local_180.first.vCurr.m_value) break;
LAB_0011225d:
    if (*ptVar14 != (type)((_Vector_impl_data *)(ptVar14 + -1))->_M_start) {
      local_180.first.edges.super_type.m_initialized = true;
      local_180.first.edges.super_type.m_storage.dummy_.aligner_ =
           (type)((_Vector_impl_data *)(ptVar14 + -1))->_M_start;
      local_180.first.edges.super_type.m_storage.dummy_._8_8_ = local_180.first.vCurr.m_value;
      local_180.first.edges.super_type.m_storage.dummy_._16_8_ = *ptVar14;
      local_180.first.edges.super_type.m_storage.dummy_._24_8_ = local_180.first.vCurr.m_value;
      goto LAB_001122e6;
    }
  }
LAB_0011227c:
  local_180.first.edges.super_type.m_initialized = false;
  local_180.first.vCurr.m_value = (value_type)pvVar15;
LAB_001122e6:
  local_180.first.vBegin.m_value = 0;
  local_180.second.vBegin.m_value = 0;
  local_180.second.edges.super_type.m_initialized = false;
  local_180.first.m_g = G;
  local_180.second.vCurr.m_value = local_180.first.vEnd.m_value;
  local_180.second.vEnd.m_value = local_180.first.vEnd.m_value;
  local_180.second.m_g = G;
  local_40 = (allocator_type *)&local_288;
  local_38 = &local_88;
  boost::tuples::
  tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&local_40,&local_180);
LAB_0011234c:
  if (CONCAT71(uStack_27f,uStack_280) == CONCAT71(uStack_7f,local_80)) {
    if (CONCAT71(uStack_27f,uStack_280) != lStack_278) {
      if ((bStack_270 == 0) || (cStack_70 == '\0')) {
LAB_00112577:
        __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c5,
                      "pointer_const_type boost::optional<std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>>::operator->() const [T = std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>]"
                     );
      }
      if (local_268 != local_68) goto LAB_00112392;
    }
    operator_delete(local_e8.m_property.px,1);
    std::
    vector<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
    ::~vector(&local_e8.super_type.m_vertices);
    while ((Graph *)local_e8.super_type.m_edges.
                    super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next != &local_e8) {
      pGVar8 = (Graph *)(((Graph *)
                         local_e8.super_type.m_edges.
                         super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                         ._M_impl._M_node.super__List_node_base._M_next)->super_type).m_edges.
                        super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                        ._M_impl._M_node.super__List_node_base._M_next;
      operator_delete(local_e8.super_type.m_edges.
                      super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next,0x28);
      local_e8.super_type.m_edges.
      super__List_base<boost::list_edge<unsigned_long,_EdgeProperties>,_std::allocator<boost::list_edge<unsigned_long,_EdgeProperties>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pGVar8;
    }
    if (local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    if (local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_1a8.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
    goto LAB_00112518;
  }
LAB_00112392:
  uVar19 = local_298 + 0x3f;
  if (-1 < (long)local_298) {
    uVar19 = local_298;
  }
  uVar22 = (ulong)((local_298 & 0x800000000000003f) < 0x8000000000000001);
  if (((local_220.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[((long)uVar19 >> 6) + (uVar22 - 1)] >>
        (local_298 & 0x3f) & 1) != 0) &&
     ((local_b0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_p[((long)uVar19 >> 6) + (uVar22 - 1)] &
      1L << ((byte)local_298 & 0x3f)) == 0)) {
    local_180.first.vBegin.m_value._0_4_ = (int)local_298;
    updatePred(G,(int *)&local_180,&local_1a8,&local_b0,pred);
  }
  if (bStack_270 != 0) {
    local_268 = local_268 + 2;
    if (local_268 == local_258) {
      uVar19 = CONCAT71(uStack_27f,uStack_280);
      lVar16 = uVar19 * 0x20 + 0x28;
      do {
        if (lStack_278 - 1U == uVar19) {
          uStack_280 = (undefined1)lStack_278;
          uStack_27f = (undefined7)((ulong)lStack_278 >> 8);
          goto LAB_0011234c;
        }
        puVar6 = *(ulong **)(*(long *)(local_248 + 0x18) + -8 + lVar16);
        puVar7 = *(ulong **)(*(long *)(local_248 + 0x18) + lVar16);
        lVar16 = lVar16 + 0x20;
        uVar19 = uVar19 + 1;
      } while (puVar7 == puVar6);
      uStack_280 = (undefined1)uVar19;
      uStack_27f = (undefined7)(uVar19 >> 8);
      local_268 = puVar6;
      local_260 = uVar19;
      local_258 = puVar7;
      local_250 = uVar19;
    }
    goto LAB_0011234c;
  }
LAB_00112596:
  __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c6,
                "pointer_type boost::optional<std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>>::operator->() [T = std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>]"
               );
}

Assistant:

bool bellmanFord(const Graph& G, const int& s, const WeightMap& weight, 
    std::vector<unsigned long>& pred, std::vector<long>& dist)
{ 
    // init
    int N = num_vertices(G);
    int phase_count = 0;
    std::queue<int> Q;
    std::vector<bool> in_Q(N, false);
    const Vertex NIL =  boost::graph_traits<Graph>::null_vertex(); // end marker
    for (unsigned long i = 0; i < N; ++i) pred[i] = i;

    dist[s] = 0;
    Q.emplace(s); 
    in_Q[s] = true;
    Q.emplace(NIL);

    // basic step
    Vertex v, u;
    OutEdgeIterator oei, oei_end;
    while(phase_count < N) {
        u = Q.front(); Q.pop();
        if ( u == NIL) { 
            phase_count++;
            if (Q.empty()) return true;
            Q.emplace(NIL);
            continue;
        } else {
            in_Q[u] = false;
        }

        long du = dist[u];
        for(boost::tie(oei, oei_end) = out_edges(u, G); oei != oei_end; ++oei) {
            v = target(*oei,G);
            long d = du + weight[*oei];
            if ( (pred[v] == v && v != s) || d < dist[v] ) { 
                dist[v] = d; 
                pred[v] = u;
                if ( !in_Q[v] ) { 
                    Q.emplace(v); 
                    in_Q[v] = true; 
                }
            }
        }   
    }

    // postprocessing
    if (pred[s] != s) return false;

    // postprocessing init
    std::vector<bool> in_R(N, false);
    std::vector<bool> reached_from_node_in_U(N,false);

    // Creating a subgraph with all adges in shortest path
    Graph g;
    EdgeIterator ei, ei_end;
    for(boost::tie(ei, ei_end) = edges(G); ei != ei_end; ++ei) {
        if (source(*ei,G) == pred[target(*ei,G)] ) {
            add_edge(source(*ei,G), target(*ei,G), g);
        }
    }
    // reachable by s -> in_R
    dfs(g, s, in_R);

    // update predecessors.
    for(boost::tie(ei, ei_end) = edges(G); ei != ei_end; ++ei) {
        if (in_Q[v] && !reached_from_node_in_U[v]) {
            updatePred(G, v, in_R, reached_from_node_in_U, pred);
        }
    }
    
    return false;
}